

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O1

t_float glist_pixelstoy(_glist *x,t_float ypix)

{
  _glist *glist;
  int iVar1;
  int iVar2;
  _glist *x_1;
  float fVar3;
  float fVar4;
  
  if ((*(uint *)&x->field_0xe8 >> 8 & 1) == 0) {
    fVar4 = x->gl_y1;
    fVar3 = ypix * (x->gl_y2 - fVar4);
    iVar2 = x->gl_zoom;
  }
  else if ((*(uint *)&x->field_0xe8 & 1) == 0) {
    if (x->gl_owner == (_glist *)0x0) {
      bug("glist_pixelstox");
    }
    glist = x->gl_owner;
    text_xpix(&x->gl_obj,glist);
    iVar1 = text_ypix(&x->gl_obj,glist);
    iVar2 = x->gl_pixheight * x->gl_zoom;
    fVar4 = x->gl_y1;
    fVar3 = (ypix - (float)iVar1) * (x->gl_y2 - fVar4);
  }
  else {
    fVar4 = x->gl_y1;
    fVar3 = ypix * (x->gl_y2 - fVar4);
    iVar2 = x->gl_screeny2 - x->gl_screeny1;
  }
  return fVar3 / (float)iVar2 + fVar4;
}

Assistant:

t_float glist_pixelstoy(t_glist *x, t_float ypix)
{
    if (!x->gl_isgraph)
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) * ypix / x->gl_zoom);
    else if (x->gl_isgraph && x->gl_havewindow)
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) *
                (ypix) / (x->gl_screeny2 - x->gl_screeny1));
    else
    {
        int x1, y1, x2, y2;
        if (!x->gl_owner)
            bug("glist_pixelstox");
        graph_graphrect(&x->gl_gobj, x->gl_owner, &x1, &y1, &x2, &y2);
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) *
            (ypix - y1) / (y2 - y1));
    }
}